

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Vk.cpp
# Opt level: O1

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersVk<Diligent::TilePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,TilePipelineStateCreateInfo *CreateInfo)

{
  IShader *pIVar1;
  pointer pvVar2;
  SHADER_TYPE *pSVar3;
  Uint32 SignatureCount;
  pointer pSVar4;
  pointer pSVar5;
  SerializedPipelineStateImpl *pSVar6;
  int iVar7;
  undefined4 extraout_var;
  size_t sVar8;
  char (*in_RCX) [57];
  char *Args_1;
  TBindIndexToDescSetIndex *BindIndexToDescSetIndex;
  long lVar9;
  ulong uVar10;
  SerializedResourceSignatureImpl **ppSrcSignatures;
  ulong uVar11;
  size_t i;
  uint uVar12;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar13;
  ShaderStageInfo *this_00;
  Uint32 SignaturesCount;
  string msg_5;
  TShaderStages ShaderStagesVk;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ShaderStages;
  string msg;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> pShaderImpl;
  IPipelineResourceSignature *DefaultSignatures [1];
  Uint32 local_174;
  string local_170;
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  local_150;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  local_138;
  SerializedPipelineStateImpl *local_120;
  undefined1 local_118 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_f8;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> RStack_f0;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> local_e8;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> RStack_e0;
  TBindIndexToDescSetIndex local_78;
  pointer local_50;
  ulong local_48;
  vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
  *local_40;
  SerializedResourceSignatureImpl *local_38;
  
  local_138.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[36]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsTilePipeline()",(char (*) [36])in_RCX);
    in_RCX = (char (*) [57])0x15a;
    DebugAssertionFailed
              ((Char *)local_118._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15a);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::_M_erase_at_end(&local_138,
                    local_138.
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_LAST) {
    FormatString<char[26],char[54]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_TILE",
               (char (*) [54])in_RCX);
    in_RCX = (char (*) [57])0x15e;
    DebugAssertionFailed
              ((Char *)local_118._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15e);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  if (CreateInfo->pTS == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pTS != nullptr",(char (*) [26])in_RCX);
    in_RCX = (char (*) [57])0x15f;
    DebugAssertionFailed
              ((Char *)local_118._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x15f);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  iVar7 = (*(CreateInfo->pTS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar7) + 8) != 0x4000) {
    FormatString<char[26],char[57]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pTS->GetDesc().ShaderType == SHADER_TYPE_TILE",in_RCX);
    in_RCX = (char (*) [57])0x160;
    DebugAssertionFailed
              ((Char *)local_118._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x160);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  pIVar1 = CreateInfo->pTS;
  local_78._M_elems[0] = 0;
  local_78._M_elems[1] = 0;
  if (pIVar1 != (IShader *)0x0) {
    (**(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject)
              (pIVar1,SerializedShaderImpl::IID_InternalImpl,&local_78);
  }
  if (local_78._M_elems._0_8_ == 0) {
    FormatString<char[40]>
              ((string *)local_118,(char (*) [40])"Unexpected shader object implementation");
    in_RCX = (char (*) [57])0x163;
    DebugAssertionFailed
              ((Char *)local_118._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x163);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::SerializedShaderImpl>
            ((RefCntAutoPtr<Diligent::SerializedShaderImpl> *)&local_78,true);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>
  ::emplace_back<Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>&>
            ((vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>
              *)&local_138,(RefCntAutoPtr<Diligent::SerializedShaderImpl> *)&local_78);
  pSVar5 = local_138.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = local_138.
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])in_RCX);
    DebugAssertionFailed
              ((Char *)local_118._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x168);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  local_120 = this;
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::Release
            ((RefCntAutoPtr<Diligent::SerializedShaderImpl> *)&local_78);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::vector(&local_150,((long)pSVar5 - (long)pSVar4 >> 4) * -0x3333333333333333,
           (allocator_type *)local_118);
  if (local_150.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_150.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pvVar13 = &(pSVar4->super_ShaderStageInfo).SPIRVs;
    lVar9 = 0x20;
    uVar11 = 0;
    do {
      pSVar3 = &(local_150.
                 super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->Type;
      *(undefined4 *)
       ((long)local_150.
              super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x20) =
           *(undefined4 *)((long)(pvVar13 + -2) + 0x10);
      std::vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>::
      _M_move_assign((vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                      *)((long)local_150.
                               super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x18),
                     (vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                      *)(pvVar13 + -1));
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::_M_move_assign((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)((long)pSVar3 + lVar9),pvVar13);
      uVar11 = uVar11 + 1;
      pvVar13 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)((long)(pvVar13 + 3) + 8);
      lVar9 = lVar9 + 0x38;
    } while (uVar11 < (ulong)(((long)local_150.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_150.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  pSVar6 = local_120;
  ppSrcSignatures =
       (SerializedResourceSignatureImpl **)
       (CreateInfo->super_PipelineStateCreateInfo).ppResourceSignatures;
  local_174 = (CreateInfo->super_PipelineStateCreateInfo).ResourceSignaturesCount;
  local_38 = (SerializedResourceSignatureImpl *)0x0;
  if (local_174 == 0) {
    CreateDefaultResourceSignature<Diligent::PipelineStateVkImpl,Diligent::PipelineResourceSignatureVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
              (local_120,Vulkan,(PipelineStateDesc *)CreateInfo,SHADER_TYPE_LAST,&local_150);
    local_38 = (pSVar6->m_pDefaultSignature).m_pObject;
    ppSrcSignatures = &local_38;
    local_174 = 1;
  }
  local_e8.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  RStack_e0.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_f8.SourceLength = 0;
  RStack_f0.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  local_118._16_8_ = 0;
  local_118._24_8_ = 0;
  local_118._0_8_ = (Char *)0x0;
  local_118._8_8_ = (PipelineResourceSignatureVkImpl *)0x0;
  Args_1 = (char *)&local_174;
  anon_unknown_60::SortResourceSignatures<Diligent::PipelineResourceSignatureVkImpl>
            ((IPipelineResourceSignature **)ppSrcSignatures,local_174,
             (SignatureArray<Diligent::PipelineResourceSignatureVkImpl> *)local_118,(Uint32 *)Args_1
            );
  SignatureCount = local_174;
  local_78._M_elems[4] = 0;
  local_78._M_elems[5] = 0;
  local_78._M_elems[6] = 0;
  local_78._M_elems[7] = 0;
  local_78._M_elems[0] = 0;
  local_78._M_elems[1] = 0;
  local_78._M_elems[2] = 0;
  local_78._M_elems[3] = 0;
  uVar11 = (ulong)local_174;
  if (uVar11 != 0) {
    uVar10 = 0;
    uVar12 = 0;
    do {
      if (*(long *)(local_118 + uVar10 * 8) != 0) {
        if (uVar10 != *(byte *)(*(long *)(local_118 + uVar10 * 8) + 0x3c)) {
          FormatString<char[26],char[40]>
                    (&local_170,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"pSignature->GetDesc().BindingIndex == i",(char (*) [40])Args_1)
          ;
          DebugAssertionFailed
                    (local_170._M_dataplus._M_p,"PatchShadersVk",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
                     ,0xa4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        local_78._M_elems[uVar10] = uVar12;
        local_170._M_dataplus._M_p = (Char *)0x0;
        local_170._M_string_length = 1;
        Args_1 = (char *)0x0;
        do {
          uVar12 = uVar12 + (*(int *)(*(long *)(local_118 + uVar10 * 8) + 0x108 +
                                     *(long *)((long)&local_170._M_dataplus._M_p + (long)Args_1) * 4
                                     ) != -1);
          Args_1 = *(char (*) [50])Args_1 + 8;
        } while (Args_1 != (char *)0x10);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar11);
    if (0x10 < uVar12) {
      FormatString<char[26],char[50]>
                (&local_170,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2",
                 (char (*) [50])Args_1);
      DebugAssertionFailed
                (local_170._M_dataplus._M_p,"PatchShadersVk",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
                 ,0xad);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
  }
  BindIndexToDescSetIndex = &local_78;
  PipelineStateVkImpl::RemapOrVerifyShaderResources
            (&local_150,(RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)local_118,
             SignatureCount,BindIndexToDescSetIndex,false,(pSVar6->m_Data).Aux.NoShaderReflection,
             (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name,
             (TShaderResources *)0x0,(TResourceAttibutions *)0x0);
  lVar9 = 0x38;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)(local_118 + lVar9));
    lVar9 = lVar9 + -8;
  } while (lVar9 != -8);
  if ((pSVar6->m_Data).Shaders._M_elems[3].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pSVar6->m_Data).Shaders._M_elems[3].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              ((string *)local_118,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty()",
               (char (*) [64])BindIndexToDescSetIndex);
    DebugAssertionFailed
              ((Char *)local_118._0_8_,"PatchShadersVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Vk.cpp"
               ,0xb9);
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  if (local_150.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_150.
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_50 = local_138.
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      this_00 = local_150.
                super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar11;
      local_40 = &local_50[uVar11].Serialized;
      lVar9 = 1;
      uVar10 = 0;
      local_48 = uVar11;
      while( true ) {
        sVar8 = PipelineStateVkImpl::ShaderStageInfo::Count(this_00);
        if (sVar8 <= uVar10) break;
        pvVar2 = (this_00->SPIRVs).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        memcpy((ShaderCreateInfo *)local_118,
               &(local_40->
                super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar10]->m_CreateInfo,0x98);
        local_118._16_8_ = 0;
        local_118._0_8_ = (Char *)0x0;
        local_e8.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
        RStack_e0.m_pObject = RStack_e0.m_pObject & 0xffffffff00000000;
        local_118._24_8_ = *(long *)((long)pvVar2 + lVar9 * 8 + -8);
        local_f8.SourceLength =
             (long)(&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start)[lVar9] - local_118._24_8_;
        SerializeShaderCreateInfo(local_120,Vulkan,(ShaderCreateInfo *)local_118);
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 3;
      }
      uVar11 = local_48 + 1;
    } while (uVar11 < (ulong)(((long)local_150.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_150.
                                     super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&local_150);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::~vector(&local_138);
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersVk(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoVk> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    PipelineStateVkImpl::TShaderStages ShaderStagesVk{ShaderStages.size()};
    for (size_t i = 0; i < ShaderStagesVk.size(); ++i)
    {
        auto& Src   = ShaderStages[i];
        auto& Dst   = ShaderStagesVk[i];
        Dst.Type    = Src.Type;
        Dst.Shaders = std::move(Src.Shaders);
        Dst.SPIRVs  = std::move(Src.SPIRVs);
    }

    auto** ppSignatures    = CreateInfo.ppResourceSignatures;
    auto   SignaturesCount = CreateInfo.ResourceSignaturesCount;

    IPipelineResourceSignature* DefaultSignatures[1] = {};
    if (CreateInfo.ResourceSignaturesCount == 0)
    {
        CreateDefaultResourceSignature<PipelineStateVkImpl, PipelineResourceSignatureVkImpl>(DeviceType::Vulkan, CreateInfo.PSODesc, ActiveShaderStages, ShaderStagesVk);

        DefaultSignatures[0] = m_pDefaultSignature;
        SignaturesCount      = 1;
        ppSignatures         = DefaultSignatures;
    }

    {
        // Sort signatures by binding index.
        // Note that SignaturesCount will be overwritten with the maximum binding index.
        SignatureArray<PipelineResourceSignatureVkImpl> Signatures = {};
        SortResourceSignatures(ppSignatures, SignaturesCount, Signatures, SignaturesCount);

        // Same as PipelineLayoutVk::Create()
        PipelineStateVkImpl::TBindIndexToDescSetIndex BindIndexToDescSetIndex = {};
        Uint32                                        DescSetLayoutCount      = 0;
        for (Uint32 i = 0; i < SignaturesCount; ++i)
        {
            const auto& pSignature = Signatures[i];
            if (pSignature == nullptr)
                continue;

            VERIFY_EXPR(pSignature->GetDesc().BindingIndex == i);
            BindIndexToDescSetIndex[i] = StaticCast<PipelineStateVkImpl::TBindIndexToDescSetIndex::value_type>(DescSetLayoutCount);

            for (auto SetId : {PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE, PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC})
            {
                if (pSignature->GetDescriptorSetSize(SetId) != ~0u)
                    ++DescSetLayoutCount;
            }
        }
        VERIFY_EXPR(DescSetLayoutCount <= MAX_RESOURCE_SIGNATURES * 2);

        const auto bStripReflection = m_Data.Aux.NoShaderReflection;
        PipelineStateVkImpl::RemapOrVerifyShaderResources(ShaderStagesVk,
                                                          Signatures.data(),
                                                          SignaturesCount,
                                                          BindIndexToDescSetIndex,
                                                          false, // bVerifyOnly
                                                          bStripReflection,
                                                          CreateInfo.PSODesc.Name);
    }

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::Vulkan)].empty());
    for (size_t j = 0; j < ShaderStagesVk.size(); ++j)
    {
        const auto& Stage = ShaderStagesVk[j];
        for (size_t i = 0; i < Stage.Count(); ++i)
        {
            const auto& SPIRV     = Stage.SPIRVs[i];
            auto        ShaderCI  = ShaderStages[j].Serialized[i]->GetCreateInfo();
            ShaderCI.Source       = nullptr;
            ShaderCI.FilePath     = nullptr;
            ShaderCI.Macros       = {};
            ShaderCI.ByteCode     = SPIRV.data();
            ShaderCI.ByteCodeSize = SPIRV.size() * sizeof(SPIRV[0]);
            SerializeShaderCreateInfo(DeviceType::Vulkan, ShaderCI);
        }
    }
}